

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-util.cc
# Opt level: O3

Index __thiscall wabt::ModuleContext::GetLabelArity(ModuleContext *this,Var *var)

{
  TypeVector *pTVar1;
  TypeVector *pTVar2;
  Index IVar3;
  Label *pLVar4;
  
  pLVar4 = GetLabel(this,var);
  if (pLVar4 == (Label *)0x0) {
    IVar3 = 0;
  }
  else {
    pTVar1 = &pLVar4->param_types;
    pTVar2 = &pLVar4->param_types;
    if (pLVar4->label_type != Loop) {
      pTVar1 = &pLVar4->result_types;
      pTVar2 = &pLVar4->result_types;
    }
    IVar3 = (Index)((ulong)((long)(pTVar2->
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar1->
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  return IVar3;
}

Assistant:

Index ModuleContext::GetLabelArity(const Var& var) const {
  auto label = GetLabel(var);
  if (!label) {
    return 0;
  }

  return label->label_type == LabelType::Loop ? label->param_types.size()
                                              : label->result_types.size();
}